

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O3

int __thiscall
QWaitConditionPrivate::wait_relative(QWaitConditionPrivate *this,QDeadlineTimer deadline)

{
  int iVar1;
  long in_FS_OFFSET;
  QDeadlineTimer local_20;
  long local_10;
  
  local_20._8_8_ = deadline._8_8_;
  local_20.t1 = deadline.t1;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._8_8_ = QDeadlineTimer::deadlineNSecs(&local_20);
  if ((long)local_20._8_8_ < 0) {
    local_20.t1 = 0;
    local_20._8_8_ = 0;
  }
  else {
    local_20.t1 = (ulong)local_20._8_8_ / 1000000000;
    local_20._8_8_ = (ulong)local_20._8_8_ % 1000000000;
  }
  iVar1 = pthread_cond_timedwait
                    ((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this,(timespec *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int wait_relative(QDeadlineTimer deadline)
    {
        timespec ti = deadlineToAbstime<QWaitConditionClockId>(deadline);
        return pthread_cond_timedwait(&cond, &mutex, &ti);
    }